

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

void __thiscall cfd::core::AdaptorSignature::AdaptorSignature(AdaptorSignature *this,ByteData *data)

{
  size_t sVar1;
  CfdException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&data->data_);
  sVar1 = ByteData::GetDataSize(&this->data_);
  if (sVar1 == 0x41) {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"Invalid adaptor signature data.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

AdaptorSignature::AdaptorSignature(const ByteData &data) : data_(data) {
  if ((data_.GetDataSize()) != AdaptorSignature::kAdaptorSignatureSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid adaptor signature data.");
  }
}